

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O0

void bhf::ads::VerifyDataLen(uint32_t type,size_t dataLen,size_t lineNumber)

{
  unsigned_long uVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  string local_768 [32];
  __cxx11 local_748 [32];
  string local_728 [32];
  __cxx11 local_708 [32];
  string local_6e8 [32];
  stringstream local_6c8 [8];
  stringstream ss_3;
  ostream local_6b8 [383];
  undefined1 local_539;
  string local_538 [32];
  stringstream local_518 [8];
  stringstream ss_2;
  ostream local_508 [383];
  undefined1 local_389;
  string local_388 [32];
  stringstream local_368 [8];
  stringstream ss_1;
  ostream local_358 [383];
  undefined1 local_1d9;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  unsigned_long local_20;
  size_t lineNumber_local;
  size_t dataLen_local;
  uint32_t type_local;
  
  local_20 = lineNumber;
  lineNumber_local = dataLen;
  dataLen_local._4_4_ = type;
  switch(type) {
  case 0:
    if (dataLen == 0) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      uVar1 = std::numeric_limits<unsigned_long>::max();
      if (uVar1 == local_20) {
        poVar2 = std::operator<<(local_198,"Invalid network data: ");
        poVar2 = std::operator<<(poVar2,"data is non-empty but type is REG_N0NE");
        std::operator<<(poVar2,'\n');
      }
      else {
        poVar2 = std::operator<<(local_198,"Invalid file format: ");
        poVar2 = std::operator<<(poVar2,"data is non-empty but type is REG_N0NE");
        poVar2 = std::operator<<(poVar2," in line ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
        std::operator<<(poVar2,'\n');
      }
      local_1d9 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(prVar3,local_1d8);
      local_1d9 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    break;
  case 1:
  case 2:
  case 3:
  case 7:
    break;
  case 4:
    if (dataLen != 4) {
      std::__cxx11::stringstream::stringstream(local_368);
      uVar1 = std::numeric_limits<unsigned_long>::max();
      if (uVar1 == local_20) {
        poVar2 = std::operator<<(local_358,"Invalid network data: ");
        poVar2 = std::operator<<(poVar2,"not enough data bytes for REG_DWORD");
        std::operator<<(poVar2,'\n');
      }
      else {
        poVar2 = std::operator<<(local_358,"Invalid file format: ");
        poVar2 = std::operator<<(poVar2,"not enough data bytes for REG_DWORD");
        poVar2 = std::operator<<(poVar2," in line ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
        std::operator<<(poVar2,'\n');
      }
      local_389 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(prVar3,local_388);
      local_389 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_6c8);
    uVar1 = std::numeric_limits<unsigned_long>::max();
    if (uVar1 == local_20) {
      poVar2 = std::operator<<(local_6b8,"Invalid network data: ");
      std::__cxx11::to_string(local_708,dataLen_local._4_4_);
      std::operator+((char *)local_6e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "unsupported type ");
      poVar2 = std::operator<<(poVar2,local_6e8);
      std::operator<<(poVar2,'\n');
      std::__cxx11::string::~string(local_6e8);
      std::__cxx11::string::~string((string *)local_708);
    }
    else {
      poVar2 = std::operator<<(local_6b8,"Invalid file format: ");
      std::__cxx11::to_string(local_748,dataLen_local._4_4_);
      std::operator+((char *)local_728,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "unsupported type ");
      poVar2 = std::operator<<(poVar2,local_728);
      poVar2 = std::operator<<(poVar2," in line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
      std::operator<<(poVar2,'\n');
      std::__cxx11::string::~string(local_728);
      std::__cxx11::string::~string((string *)local_748);
    }
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar3,local_768);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 0xb:
    if (dataLen != 8) {
      std::__cxx11::stringstream::stringstream(local_518);
      uVar1 = std::numeric_limits<unsigned_long>::max();
      if (uVar1 == local_20) {
        poVar2 = std::operator<<(local_508,"Invalid network data: ");
        poVar2 = std::operator<<(poVar2,"not enough data bytes for REG_QWORD");
        std::operator<<(poVar2,'\n');
      }
      else {
        poVar2 = std::operator<<(local_508,"Invalid file format: ");
        poVar2 = std::operator<<(poVar2,"not enough data bytes for REG_QWORD");
        poVar2 = std::operator<<(poVar2," in line ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
        std::operator<<(poVar2,'\n');
      }
      local_539 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(prVar3,local_538);
      local_539 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

static void VerifyDataLen(const uint32_t type, const size_t dataLen, const size_t lineNumber)
{
    switch (type) {
    case REG_NONE:
        if (!dataLen) {
            PARSING_EXCEPTION("data is non-empty but type is REG_N0NE");
        }
        break;

    case REG_SZ:
    case REG_EXPAND_SZ:
    case REG_BINARY:
    case REG_MULTI_SZ:
        break;

    case REG_DWORD:
        if (sizeof(uint32_t) != dataLen) {
            PARSING_EXCEPTION("not enough data bytes for REG_DWORD");
        }
        break;

    case REG_QWORD:
        if (sizeof(uint64_t) != dataLen) {
            PARSING_EXCEPTION("not enough data bytes for REG_QWORD");
        }
        break;

    default:
        PARSING_EXCEPTION("unsupported type " + std::to_string(type));
    }
}